

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O2

atom_server init_atom_server(atom_cache_type cache_style)

{
  int iVar1;
  atom_server as;
  char *pcVar2;
  hostent *phVar3;
  in_addr_t iVar4;
  long lVar5;
  
  as = (atom_server)malloc(0xd8);
  if (atom_server_host == (char *)0x0) {
    pcVar2 = getenv("ATOM_SERVER_HOST");
    atom_server_host = "atomhost.cercs.gatech.edu";
    if (pcVar2 != (char *)0x0) {
      atom_server_host = pcVar2;
    }
  }
  as->server_id = atom_server_host;
  as->tcp_fd = -1;
  pcVar2 = getenv("ATL_USE_TCP");
  as->use_tcp = (uint)(pcVar2 != (char *)0x0);
  as->no_server = 1;
  iVar4 = 0;
  Tcl_InitHashTable(&as->string_hash_table,0);
  Tcl_InitHashTable(&as->value_hash_table,1);
  phVar3 = gethostbyname(atom_server_host);
  as->he = (hostent *)phVar3;
  if (phVar3 == (hostent *)0x0) {
    as->he = (hostent *)0x0;
  }
  else {
    iVar4 = *(in_addr_t *)*phVar3->h_addr_list;
  }
  (as->their_addr).sin_addr.s_addr = iVar4;
  iVar1 = socket(2,2,0);
  as->sockfd = iVar1;
  if (iVar1 == -1) {
    perror("socket");
    exit(1);
  }
  iVar1 = fcntl(iVar1,3);
  as->flags = iVar1;
  (as->their_addr).sin_family = 2;
  (as->their_addr).sin_port = 0x5c11;
  (as->their_addr).sin_zero[0] = '\0';
  (as->their_addr).sin_zero[1] = '\0';
  (as->their_addr).sin_zero[2] = '\0';
  (as->their_addr).sin_zero[3] = '\0';
  (as->their_addr).sin_zero[4] = '\0';
  (as->their_addr).sin_zero[5] = '\0';
  (as->their_addr).sin_zero[6] = '\0';
  (as->their_addr).sin_zero[7] = '\0';
  for (lVar5 = 0; lVar5 != 0x268; lVar5 = lVar5 + 8) {
    atom_from_string(as,*(char **)((long)in_use_values + lVar5));
  }
  as->no_server = 0;
  return as;
}

Assistant:

atom_server
init_atom_server(atom_cache_type cache_style)
{
    atom_server as = (atom_server) malloc(sizeof(atom_server_struct));

    nt_socket_init_func();
    if (atom_server_host == NULL) {	/* environment override */
	atom_server_host = getenv("ATOM_SERVER_HOST");
    }
    if (atom_server_host == NULL) {
	atom_server_host = ATOM_SERVER_HOST;	/* from configure */
    }
    as->server_id = atom_server_host;
    as->tcp_fd = -1;
    as->use_tcp = (getenv("ATL_USE_TCP") != NULL);
    as->no_server = 1;

    Tcl_InitHashTable(&as->string_hash_table, TCL_STRING_KEYS);
    Tcl_InitHashTable(&as->value_hash_table, TCL_ONE_WORD_KEYS);

    if ((as->he = gethostbyname(atom_server_host)) == NULL) {
	as->he = NULL;
	as->their_addr.sin_addr.s_addr = 0;
    } else {
	as->their_addr.sin_addr = *((struct in_addr *) as->he->h_addr);
    }
    if ((as->sockfd = (int) socket(AF_INET, SOCK_DGRAM, 0)) == -1) {
	perror("socket");
	exit(1);
    }
#ifndef HAVE_WINDOWS_H
    as->flags = fcntl(as->sockfd, F_GETFL);
#else
    as->flags = 0;
#endif
    as->their_addr.sin_family = AF_INET;
    as->their_addr.sin_port = htons(UDP_PORT);
    memset(&(as->their_addr.sin_zero), '\0', 8);

    preload_in_use_atoms(as);
    as->no_server = 0;
    return as;
}